

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

int set_wall(level *lev,int x,int y,int horiz)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  if (horiz == 0) {
    uVar3 = 1;
    if ((uint)y < 0x15 && x - 2U < 0x4f) {
      cVar1 = lev->locations[x - 1][(uint)y].typ;
      uVar3 = (uint)(cVar1 == '\x18' || cVar1 < '\x11');
    }
    iVar4 = 2;
    if (0x4e < (uint)x || 0x14 < (uint)y) goto LAB_0016c8e6;
    x = x + 1;
  }
  else {
    uVar3 = 1;
    if (y - 1U < 0x15 && x - 1U < 0x4f) {
      cVar1 = lev->locations[(uint)x][y - 1U].typ;
      uVar3 = (uint)(cVar1 == '\x18' || cVar1 < '\x11');
    }
    y = y + 1;
    iVar4 = 2;
    if (0x4e < x - 1U || 0x14 < (uint)y) goto LAB_0016c8e6;
  }
  cVar1 = lev->locations[(uint)x][(uint)y].typ;
  iVar4 = (uint)(cVar1 == '\x18' || cVar1 < '\x11') * 2;
LAB_0016c8e6:
  iVar2 = 0;
  if (iVar4 == 0) {
    iVar2 = iVar4 + uVar3;
  }
  if (uVar3 == 0) {
    iVar2 = iVar4 + uVar3;
  }
  return iVar2;
}

Assistant:

static int set_wall(struct level *lev, int x, int y, int horiz)
{
    int wmode, is_1, is_2;

    if (horiz) {
	is_1 = check_pos(lev, x,y-1, WM_W_TOP);
	is_2 = check_pos(lev, x,y+1, WM_W_BOTTOM);
    } else {
	is_1 = check_pos(lev, x-1,y, WM_W_LEFT);
	is_2 = check_pos(lev, x+1,y, WM_W_RIGHT);
    }
    if (more_than_one(is_1, is_2, 0)) {
	wmode = 0;
    } else {
	wmode = is_1 + is_2;
    }
    return wmode;
}